

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)1,google::protobuf::io::ZeroCopyInputStream*>
          (MessageLite *this,ZeroCopyInputStream **input)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TcParseTableBase *tc_table;
  MessageLite local_30;
  TcParseTableBase *local_20;
  
  (*this->_vptr_MessageLite[2])();
  iVar2 = (*this->_vptr_MessageLite[4])(this);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    ParseFrom<(google::protobuf::MessageLite::ParseFlags)1,google::protobuf::io::ZeroCopyInputStream*>
              (&local_30);
  }
  else {
    tc_table = *(TcParseTableBase **)(CONCAT44(extraout_var,iVar2) + 8);
    if (tc_table != (TcParseTableBase *)0x0) goto LAB_00245878;
  }
  ParseFrom<(google::protobuf::MessageLite::ParseFlags)1,google::protobuf::io::ZeroCopyInputStream*>
            ();
  tc_table = local_20;
LAB_00245878:
  bVar1 = internal::MergeFromImpl<false>(*input,this,tc_table,kParse);
  return bVar1;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = (flags & kMergeWithAliasing) != 0;
  const internal::TcParseTableBase* tc_table;
  PROTOBUF_ALWAYS_INLINE_CALL tc_table = GetTcParseTable();
  return internal::MergeFromImpl<alias>(input, this, tc_table, flags);
}